

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O3

asn_dec_rval_t
SET_OF_decode_xer(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 char *opt_mname,void *buf_ptr,size_t size)

{
  short *psVar1;
  asn_TYPE_member_s *paVar2;
  int *piVar3;
  void **ppvVar4;
  short sVar5;
  int iVar6;
  xer_check_tag_e xVar7;
  ssize_t sVar8;
  undefined8 uVar9;
  size_t num;
  size_t sVar11;
  asn_dec_rval_t aVar12;
  asn_anonymous_set_ *list;
  pxer_chunk_type_e ch_type;
  char *local_70;
  void *local_60;
  pxer_chunk_type_e local_54;
  char *local_50;
  asn_codec_ctx_t *local_48;
  void **local_40;
  int *local_38;
  size_t sVar10;
  
  local_50 = opt_mname;
  if (opt_mname == (char *)0x0) {
    local_50 = td->xml_tag;
  }
  paVar2 = td->elements;
  piVar3 = (int *)td->specifics;
  local_60 = *struct_ptr;
  local_48 = opt_codec_ctx;
  if (local_60 == (void *)0x0) {
    local_60 = calloc(1,(long)*piVar3);
    *struct_ptr = local_60;
    if (local_60 == (void *)0x0) {
      uVar9 = 2;
      sVar11 = 0;
      goto LAB_00145efa;
    }
  }
  if (piVar3[2] == 0) {
    local_70 = paVar2->name;
    if (*local_70 == '\0') {
      local_70 = paVar2->type->xml_tag;
    }
  }
  else {
    local_70 = (char *)0x0;
    if (piVar3[2] != 1) {
      local_70 = "";
    }
  }
  psVar1 = (short *)((long)local_60 + (long)piVar3[1]);
  sVar5 = *(short *)((long)local_60 + (long)piVar3[1]);
  if (sVar5 < 3) {
    local_40 = (void **)(psVar1 + 4);
    local_38 = (int *)(psVar1 + 2);
    sVar11 = 0;
    do {
      ppvVar4 = local_40;
      if (sVar5 == 2) {
        aVar12 = (*paVar2->type->xer_decoder)(local_48,paVar2->type,local_40,local_70,buf_ptr,size);
        sVar10 = aVar12.consumed;
        uVar9 = aVar12._0_8_;
        if (aVar12.code != RC_OK) {
          sVar11 = sVar11 + sVar10;
          goto LAB_00145efa;
        }
        iVar6 = asn_set_add(local_60,*ppvVar4);
        if (iVar6 != 0) goto LAB_00145ef5;
        psVar1[4] = 0;
        psVar1[5] = 0;
        psVar1[6] = 0;
        psVar1[7] = 0;
        buf_ptr = (void *)((long)buf_ptr + sVar10);
        size = size - sVar10;
        sVar11 = sVar11 + sVar10;
        *psVar1 = 1;
      }
      sVar8 = xer_next_token(local_38,buf_ptr,size,&local_54);
      if (sVar8 == -1) goto LAB_00145ef5;
      if (local_54 - PXER_TEXT < 2) {
        buf_ptr = (void *)((long)buf_ptr + sVar8);
        size = size - sVar8;
        sVar11 = sVar11 + sVar8;
        sVar5 = *psVar1;
      }
      else {
        if (local_54 == PXER_WMORE) {
          uVar9 = 1;
          goto LAB_00145efa;
        }
        xVar7 = xer_check_tag(buf_ptr,(int)sVar8,local_50);
        if (6 < xVar7 - XCT_OPENING) break;
        sVar5 = *psVar1;
        switch(xVar7) {
        case XCT_OPENING:
          if (sVar5 != 1) {
            if (sVar5 == 0) {
              buf_ptr = (void *)((long)buf_ptr + sVar8);
              size = size - sVar8;
              sVar11 = sVar11 + sVar8;
              *psVar1 = 1;
              sVar5 = 1;
              goto LAB_00145edb;
            }
            goto switchD_00145ea5_caseD_4;
          }
          break;
        case XCT_CLOSING:
          if (sVar5 != 0) {
LAB_00145f2c:
            sVar11 = sVar11 + sVar8;
            *psVar1 = 3;
            uVar9 = 0;
            goto LAB_00145efa;
          }
          goto switchD_00145ea5_caseD_4;
        case XCT_BOTH:
          if (sVar5 != 1) {
            if (sVar5 == 0) goto LAB_00145f2c;
            goto switchD_00145ea5_caseD_4;
          }
          break;
        default:
          goto switchD_00145ea5_caseD_4;
        case XCT_UNKNOWN_OP:
        case XCT_UNKNOWN_BO:
          if (sVar5 != 1) goto switchD_00145ea5_caseD_4;
        }
        *psVar1 = 2;
        sVar5 = 2;
      }
LAB_00145edb:
    } while (sVar5 < 3);
  }
  else {
    sVar11 = 0;
  }
switchD_00145ea5_caseD_4:
  *psVar1 = 3;
LAB_00145ef5:
  uVar9 = 2;
LAB_00145efa:
  aVar12.consumed = sVar11;
  aVar12._0_8_ = uVar9;
  return aVar12;
}

Assistant:

asn_dec_rval_t
SET_OF_decode_xer(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const char *opt_mname,
		const void *buf_ptr, size_t size) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *element = td->elements;
	const char *elm_tag;
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;

	/*
	 * ... and parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	asn_dec_rval_t rval;		/* Return value from a decoder */
	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */

	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) RETURN(RC_FAIL);
	}

	/* Which tag is expected for the downstream */
	if(specs->as_XMLValueList) {
		elm_tag = (specs->as_XMLValueList == 1) ? 0 : "";
	} else {
		elm_tag = (*element->name)
				? element->name : element->type->xml_tag;
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);

	/*
	 * Phases of XER/XML processing:
	 * Phase 0: Check that the opening tag matches our expectations.
	 * Phase 1: Processing body and reacting on closing tag.
	 * Phase 2: Processing inner type.
	 */
	for(; ctx->phase <= 2;) {
		pxer_chunk_type_e ch_type;	/* XER chunk type */
		ssize_t ch_size;		/* Chunk size */
		xer_check_tag_e tcv;		/* Tag check value */

		/*
		 * Go inside the inner member of a set.
		 */
		if(ctx->phase == 2) {
			asn_dec_rval_t tmprval;

			/* Invoke the inner type decoder, m.b. multiple times */
			ASN_DEBUG("XER/SET OF element [%s]", elm_tag);
			tmprval = element->type->xer_decoder(opt_codec_ctx,
					element->type, &ctx->ptr, elm_tag,
					buf_ptr, size);
			if(tmprval.code == RC_OK) {
				asn_anonymous_set_ *list = _A_SET_FROM_VOID(st);
				if(ASN_SET_ADD(list, ctx->ptr) != 0)
					RETURN(RC_FAIL);
				ctx->ptr = 0;
				XER_ADVANCE(tmprval.consumed);
			} else {
				XER_ADVANCE(tmprval.consumed);
				RETURN(tmprval.code);
			}
			ctx->phase = 1;	/* Back to body processing */
			ASN_DEBUG("XER/SET OF phase => %d", ctx->phase);
			/* Fall through */
		}

		/*
		 * Get the next part of the XML stream.
		 */
		ch_size = xer_next_token(&ctx->context,
			buf_ptr, size, &ch_type);
		if(ch_size == -1) {
            RETURN(RC_FAIL);
        } else {
			switch(ch_type) {
            case PXER_WMORE:
                RETURN(RC_WMORE);
			case PXER_COMMENT:	/* Got XML comment */
			case PXER_TEXT:		/* Ignore free-standing text */
				XER_ADVANCE(ch_size);	/* Skip silently */
				continue;
			case PXER_TAG:
				break;	/* Check the rest down there */
			}
		}

		tcv = xer_check_tag(buf_ptr, ch_size, xml_tag);
		ASN_DEBUG("XER/SET OF: tcv = %d, ph=%d t=%s",
			tcv, ctx->phase, xml_tag);
		switch(tcv) {
		case XCT_CLOSING:
			if(ctx->phase == 0) break;
			ctx->phase = 0;
			/* Fall through */
		case XCT_BOTH:
			if(ctx->phase == 0) {
				/* No more things to decode */
				XER_ADVANCE(ch_size);
				ctx->phase = 3;	/* Phase out */
				RETURN(RC_OK);
			}
			/* Fall through */
		case XCT_OPENING:
			if(ctx->phase == 0) {
				XER_ADVANCE(ch_size);
				ctx->phase = 1;	/* Processing body phase */
				continue;
			}
			/* Fall through */
		case XCT_UNKNOWN_OP:
		case XCT_UNKNOWN_BO:

			ASN_DEBUG("XER/SET OF: tcv=%d, ph=%d", tcv, ctx->phase);
			if(ctx->phase == 1) {
				/*
				 * Process a single possible member.
				 */
				ctx->phase = 2;
				continue;
			}
			/* Fall through */
		default:
			break;
		}

		ASN_DEBUG("Unexpected XML tag in SET OF");
		break;
	}

	ctx->phase = 3;	/* "Phase out" on hard failure */
	RETURN(RC_FAIL);
}